

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl.cpp
# Opt level: O1

int LiveGLSLRender(LiveGLSL *live_glsl)

{
  uint uVar1;
  uint uVar2;
  pointer pcVar3;
  pointer pGVar4;
  pointer pTVar5;
  HGUI handle;
  size_t __n;
  double dVar6;
  bool bVar7;
  uint32_t *puVar8;
  PFNGLGETUNIFORMLOCATIONPROC p_Var9;
  PFNGLUNIFORM1FPROC p_Var10;
  PFNGLUNIFORM1IPROC p_Var11;
  PFNGLUNIFORM2FPROC p_Var12;
  PFNGLUNIFORM3FPROC p_Var13;
  int iVar14;
  GLint GVar15;
  int iVar16;
  GLuint GVar17;
  void *data;
  uint32_t *puVar18;
  GUIComponent *gui_component;
  pointer pGVar19;
  pointer pRVar20;
  pointer pRVar21;
  RenderPass *other;
  pointer pTVar22;
  pointer pRVar23;
  GLsizei y_00;
  RenderPass *render_pass;
  float fVar24;
  float fVar25;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *__range3;
  GUITexture guiTexture;
  vector<GUITexture,_std::allocator<GUITexture>_> textures;
  double y;
  double x;
  GUITexture local_f8;
  long local_e8 [2];
  pointer local_d8;
  int local_cc;
  pointer local_c8;
  GLfloat local_bc;
  vector<GUITexture,_std::allocator<GUITexture>_> local_b8;
  double local_98;
  double local_90;
  string *local_88;
  uint32_t *local_80;
  uint32_t *local_78;
  pointer local_70;
  vector<GUITexture,_std::allocator<GUITexture>_> local_68;
  string local_50;
  
  glfwGetTime();
  local_78 = (uint32_t *)&live_glsl->WindowWidth;
  local_80 = (uint32_t *)&live_glsl->WindowHeight;
  local_88 = &(live_glsl->Args).Output;
  do {
    iVar14 = glfwWindowShouldClose(live_glsl->GLFWWindowHandle);
    if (iVar14 != 0) {
      return 0;
    }
    pcVar3 = (live_glsl->ShaderPath)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + (live_glsl->ShaderPath)._M_string_length);
    ReloadShaderIfChanged(live_glsl,&local_50,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    glfwGetCursorPos(live_glsl->GLFWWindowHandle,&local_90,&local_98);
    local_90 = local_90 * (double)live_glsl->PixelDensity;
    local_98 = (double)live_glsl->PixelDensity * local_98;
    iVar14 = glfwGetMouseButton(live_glsl->GLFWWindowHandle,0);
    if (live_glsl->ShaderCompiled == true) {
      pGVar4 = (live_glsl->GUIComponents).
               super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pGVar19 = (live_glsl->GUIComponents).
                     super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
                     super__Vector_impl_data._M_start; pGVar19 != pGVar4; pGVar19 = pGVar19 + 1) {
        pGVar19->IsInUse = false;
        pRVar23 = (live_glsl->RenderPasses).
                  super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pRVar20 = (live_glsl->RenderPasses).
                       super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                       super__Vector_impl_data._M_start; pRVar20 != pRVar23; pRVar20 = pRVar20 + 1)
        {
          GVar15 = (*glad_glGetUniformLocation)
                             ((pRVar20->Program).Handle,(pGVar19->UniformName)._M_dataplus._M_p);
          pGVar19->IsInUse = (bool)(pGVar19->IsInUse | GVar15 != -1);
        }
      }
    }
    local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
    super__Vector_impl_data._M_finish = (GUITexture *)0x0;
    local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (GUITexture *)0x0;
    pRVar23 = (live_glsl->RenderPasses).super__Vector_base<RenderPass,_std::allocator<RenderPass>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (pRVar20 = (live_glsl->RenderPasses).
                   super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                   super__Vector_impl_data._M_start; pRVar20 != pRVar23; pRVar20 = pRVar20 + 1) {
      GVar17 = pRVar20->TextureId;
      if (GVar17 != 0) {
        local_f8.Width = pRVar20->Width;
        local_f8.Height = pRVar20->Height;
        local_f8.Id = GVar17;
        if (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<GUITexture,std::allocator<GUITexture>>::_M_realloc_insert<GUITexture_const&>
                    ((vector<GUITexture,std::allocator<GUITexture>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_f8);
        }
        else {
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Height = local_f8.Height;
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Id = GVar17;
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Width = local_f8.Width;
          local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      pTVar5 = (pRVar20->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pTVar22 = (pRVar20->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
                     _M_impl.super__Vector_impl_data._M_start; pTVar22 != pTVar5;
          pTVar22 = pTVar22 + 1) {
        local_f8.Width = pTVar22->Width;
        local_f8.Height = pTVar22->Height;
        local_f8.Id = pTVar22->Id;
        if (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<GUITexture,std::allocator<GUITexture>>::_M_realloc_insert<GUITexture_const&>
                    ((vector<GUITexture,std::allocator<GUITexture>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_f8);
        }
        else {
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Height = local_f8.Height;
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Id = local_f8.Id;
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Width = local_f8.Width;
          local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
    }
    handle = live_glsl->GUI;
    std::vector<GUITexture,_std::allocator<GUITexture>_>::vector(&local_68,&local_b8);
    GUINewFrame(handle,&live_glsl->GUIComponents,&local_68);
    if (local_68.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (live_glsl->ShaderCompiled == true) {
      pRVar20 = (live_glsl->RenderPasses).
                super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_70 = (live_glsl->RenderPasses).
                 super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (pRVar20 != local_70) {
        local_bc = 1.0;
        if (iVar14 != 1) {
          local_bc = 0.0;
        }
        do {
          puVar18 = &pRVar20->Height;
          puVar8 = &pRVar20->Width;
          if (pRVar20->IsMain != false) {
            puVar18 = local_80;
            puVar8 = local_78;
          }
          uVar1 = *puVar8;
          uVar2 = *puVar18;
          local_c8 = (pointer)CONCAT44(local_c8._4_4_,live_glsl->PixelDensity);
          local_d8 = pRVar20;
          (*glad_glBindFramebuffer)(0x8d40,pRVar20->FBO);
          (*glad_glClear)(0x4000);
          GVar17 = (local_d8->Program).Handle;
          if (GVar17 == 0) {
            __assert_fail("render_pass.Program.Handle != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/liveglsl.cpp"
                          ,0xfb,"int LiveGLSLRender(LiveGLSL *)");
          }
          (*glad_glUseProgram)(GVar17);
          (*glad_glBindBuffer)(0x8892,live_glsl->VertexBufferId);
          fVar24 = (float)uVar1 * local_c8._0_4_;
          fVar25 = (float)uVar2 * local_c8._0_4_;
          (*glad_glViewport)(0,0,(GLsizei)(long)fVar24,(GLsizei)(long)fVar25);
          p_Var12 = glad_glUniform2f;
          GVar15 = (*glad_glGetUniformLocation)((local_d8->Program).Handle,"resolution");
          (*p_Var12)(GVar15,(float)((long)fVar24 & 0xffffffff),(float)((long)fVar25 & 0xffffffff));
          p_Var10 = glad_glUniform1f;
          GVar15 = (*glad_glGetUniformLocation)((local_d8->Program).Handle,"time");
          dVar6 = glfwGetTime();
          (*p_Var10)(GVar15,(float)dVar6);
          p_Var10 = glad_glUniform1f;
          GVar15 = (*glad_glGetUniformLocation)((local_d8->Program).Handle,"pixel_ratio");
          (*p_Var10)(GVar15,live_glsl->PixelDensity);
          p_Var13 = glad_glUniform3f;
          GVar15 = (*glad_glGetUniformLocation)((local_d8->Program).Handle,"mouse");
          (*p_Var13)(GVar15,(float)local_90,(float)local_98,local_bc);
          iVar14 = 0;
          pRVar20 = local_d8;
          if ((local_d8->Input)._M_string_length != 0) {
            pRVar23 = (live_glsl->RenderPasses).
                      super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pRVar21 = (live_glsl->RenderPasses).
                      super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (pRVar23 != pRVar21) {
              iVar14 = 0;
              local_c8 = pRVar21;
              do {
                __n = (pRVar23->Output)._M_string_length;
                if ((__n == (pRVar20->Input)._M_string_length) &&
                   ((__n == 0 ||
                    (iVar16 = bcmp((pRVar23->Output)._M_dataplus._M_p,
                                   (pRVar20->Input)._M_dataplus._M_p,__n), iVar16 == 0)))) {
                  (*glad_glActiveTexture)(iVar14 + 0x84c0);
                  (*glad_glBindTexture)(0xde1,pRVar23->TextureId);
                  p_Var11 = glad_glUniform1i;
                  GVar15 = (*glad_glGetUniformLocation)
                                     ((pRVar20->Program).Handle,(pRVar20->Input)._M_dataplus._M_p);
                  (*p_Var11)(GVar15,iVar14);
                  p_Var12 = glad_glUniform2f;
                  p_Var9 = glad_glGetUniformLocation;
                  GVar17 = (pRVar20->Program).Handle;
                  local_f8._0_8_ = local_e8;
                  pcVar3 = (pRVar20->Input)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_f8,pcVar3,pcVar3 + (pRVar20->Input)._M_string_length);
                  std::__cxx11::string::append((char *)&local_f8);
                  GVar15 = (*p_Var9)(GVar17,(GLchar *)local_f8._0_8_);
                  (*p_Var12)(GVar15,(float)pRVar23->Width,(float)pRVar23->Height);
                  if ((long *)local_f8._0_8_ != local_e8) {
                    operator_delete((void *)local_f8._0_8_,local_e8[0] + 1);
                  }
                  iVar14 = iVar14 + 1;
                  pRVar20 = local_d8;
                  pRVar21 = local_c8;
                }
                pRVar23 = pRVar23 + 1;
              } while (pRVar23 != pRVar21);
            }
          }
          pGVar4 = (live_glsl->GUIComponents).
                   super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pGVar19 = (live_glsl->GUIComponents).
                         super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
                         super__Vector_impl_data._M_start; pGVar19 != pGVar4; pGVar19 = pGVar19 + 1)
          {
            GVar15 = (*glad_glGetUniformLocation)
                               ((pRVar20->Program).Handle,(pGVar19->UniformName)._M_dataplus._M_p);
            switch(pGVar19->UniformType) {
            case EGUIUniformTypeFloat:
              (*glad_glUniform1f)(GVar15,pGVar19->Data[0]);
              break;
            case EGUIUniformTypeVec2:
              (*glad_glUniform2f)(GVar15,pGVar19->Data[0],pGVar19->Data[1]);
              break;
            case EGUIUniformTypeVec3:
              (*glad_glUniform3f)(GVar15,pGVar19->Data[0],pGVar19->Data[1],pGVar19->Data[2]);
              break;
            case EGUIUniformTypeVec4:
              (*glad_glUniform4f)(GVar15,pGVar19->Data[0],pGVar19->Data[1],pGVar19->Data[2],
                                  pGVar19->Data[3]);
            }
          }
          pTVar22 = (pRVar20->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_c8 = (pointer)(pRVar20->Textures).
                              super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                              super__Vector_impl_data._M_finish;
          if ((pointer)pTVar22 != local_c8) {
            do {
              (*glad_glActiveTexture)(iVar14 + 0x84c0);
              (*glad_glBindTexture)(0xde1,pTVar22->Id);
              p_Var11 = glad_glUniform1i;
              GVar15 = (*glad_glGetUniformLocation)
                                 ((pRVar20->Program).Handle,(pTVar22->Binding)._M_dataplus._M_p);
              (*p_Var11)(GVar15,iVar14);
              p_Var12 = glad_glUniform2f;
              p_Var9 = glad_glGetUniformLocation;
              GVar17 = (pRVar20->Program).Handle;
              local_f8._0_8_ = local_e8;
              pcVar3 = (pTVar22->Binding)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f8,pcVar3,pcVar3 + (pTVar22->Binding)._M_string_length);
              std::__cxx11::string::append((char *)&local_f8);
              GVar15 = (*p_Var9)(GVar17,(GLchar *)local_f8._0_8_);
              (*p_Var12)(GVar15,(float)pTVar22->Width,(float)pTVar22->Height);
              if ((long *)local_f8._0_8_ != local_e8) {
                operator_delete((void *)local_f8._0_8_,local_e8[0] + 1);
              }
              iVar14 = iVar14 + 1;
              pTVar22 = pTVar22 + 1;
              pRVar20 = local_d8;
            } while ((pointer)pTVar22 != local_c8);
          }
          (*glad_glBindVertexArray)(live_glsl->VaoId);
          pRVar21 = (live_glsl->RenderPasses).
                    super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          for (pRVar23 = (live_glsl->RenderPasses).
                         super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                         super__Vector_impl_data._M_start; pRVar23 != pRVar21; pRVar23 = pRVar23 + 1
              ) {
            if (pRVar23->IsMain == true) {
              GVar17 = (*glad_glGetAttribLocation)((pRVar23->Program).Handle,"position");
              (*glad_glVertexAttribPointer)(GVar17,2,0x1406,'\0',8,(void *)0x0);
              (*glad_glEnableVertexAttribArray)(GVar17);
            }
          }
          (*glad_glDrawArrays)(4,0,6);
          pRVar20 = pRVar20 + 1;
        } while (pRVar20 != local_70);
      }
      live_glsl->IsContinuousRendering = false;
      pRVar23 = (live_glsl->RenderPasses).
                super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (pRVar20 = (live_glsl->RenderPasses).
                     super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                     super__Vector_impl_data._M_start; pRVar20 != pRVar23; pRVar20 = pRVar20 + 1) {
        GVar15 = (*glad_glGetUniformLocation)((pRVar20->Program).Handle,"time");
        live_glsl->IsContinuousRendering = (bool)(live_glsl->IsContinuousRendering | GVar15 != -1);
      }
      if ((live_glsl->Args).Output._M_string_length == 0) goto LAB_00113d1f;
      iVar14 = (int)(long)((float)live_glsl->WindowWidth * live_glsl->PixelDensity);
      y_00 = (GLsizei)(long)((float)live_glsl->WindowHeight * live_glsl->PixelDensity);
      data = operator_new__((ulong)(uint)(iVar14 * 3 * y_00));
      (*glad_glReadPixels)(0,0,iVar14,y_00,0x1907,0x1401,data);
      iVar14 = stbi_write_png((local_88->_M_dataplus)._M_p,iVar14,y_00,3,data,iVar14 * 3);
      operator_delete__(data);
      bVar7 = false;
      local_cc = 0;
      if (iVar14 == 0) {
        LiveGLSLRender();
        local_cc = 1;
        bVar7 = false;
      }
    }
    else {
      (*glad_glBindFramebuffer)(0x8d40,0);
      (*glad_glClear)(0x4000);
LAB_00113d1f:
      GUIRender(live_glsl->GUI);
      glfwSwapBuffers(live_glsl->GLFWWindowHandle);
      if (live_glsl->IsContinuousRendering == true) {
        bVar7 = true;
        glfwPollEvents();
      }
      else {
        bVar7 = true;
        glfwWaitEvents();
      }
    }
    if (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (!bVar7) {
      return local_cc;
    }
  } while( true );
}

Assistant:

int LiveGLSLRender(LiveGLSL* live_glsl) {
    double previous_time = glfwGetTime();
    uint32_t frame_count = 0;

    while (!glfwWindowShouldClose(live_glsl->GLFWWindowHandle)) {
        ReloadShaderIfChanged(live_glsl, live_glsl->ShaderPath);

        double x, y;
        glfwGetCursorPos(live_glsl->GLFWWindowHandle, &x, &y);
        x *= live_glsl->PixelDensity;
        y *= live_glsl->PixelDensity;

        int mouse_left_state = glfwGetMouseButton(live_glsl->GLFWWindowHandle, GLFW_MOUSE_BUTTON_LEFT);

        if (live_glsl->ShaderCompiled) {
            for (GUIComponent& gui_component : live_glsl->GUIComponents) {
                gui_component.IsInUse = false;
                for (const auto& render_pass : live_glsl->RenderPasses) {
                    GLuint uniform_location = glGetUniformLocation(render_pass.Program.Handle, gui_component.UniformName.c_str());
                    gui_component.IsInUse |= uniform_location != -1;
                }
            }
        }

        std::vector<GUITexture> textures;
        for (const auto& render_pass : live_glsl->RenderPasses) {
            if (render_pass.TextureId) {
                GUITexture guiTexture;
                guiTexture.Width = render_pass.Width;
                guiTexture.Height = render_pass.Height;
                guiTexture.Id = render_pass.TextureId;
                textures.push_back(guiTexture);
            }
            for (const auto& texture : render_pass.Textures) {
                GUITexture guiTexture;
                guiTexture.Width = texture.Width;
                guiTexture.Height = texture.Height;
                guiTexture.Id = texture.Id;
                textures.push_back(guiTexture);
            }
        }

        GUINewFrame(live_glsl->GUI, live_glsl->GUIComponents, textures);

        if (live_glsl->ShaderCompiled) {
            for (const auto& render_pass : live_glsl->RenderPasses) {
                uint32_t width = render_pass.IsMain ? live_glsl->WindowWidth : render_pass.Width;
                uint32_t height = render_pass.IsMain ? live_glsl->WindowHeight : render_pass.Height;

                width *= live_glsl->PixelDensity;
                height *= live_glsl->PixelDensity;

                glBindFramebuffer(GL_FRAMEBUFFER, render_pass.FBO);
                glClear(GL_COLOR_BUFFER_BIT);

                assert(render_pass.Program.Handle != 0);
                glUseProgram(render_pass.Program.Handle);

                glBindBuffer(GL_ARRAY_BUFFER, live_glsl->VertexBufferId);
                glViewport(0, 0, width, height);

                glUniform2f(glGetUniformLocation(render_pass.Program.Handle, "resolution"), width, height);
                glUniform1f(glGetUniformLocation(render_pass.Program.Handle, "time"), glfwGetTime());
                glUniform1f(glGetUniformLocation(render_pass.Program.Handle, "pixel_ratio"), live_glsl->PixelDensity);
                // Mouse position, x relative to left, y relative to top
                glUniform3f(glGetUniformLocation(render_pass.Program.Handle, "mouse"), x, y, mouse_left_state == GLFW_PRESS ? 1.0f : 0.0f);

                int texture_unit = 0;

                if (!render_pass.Input.empty()) {
                    for (const auto& other : live_glsl->RenderPasses) {
                        if (other.Output == render_pass.Input) {
                            glActiveTexture(GL_TEXTURE0 + texture_unit);
                            glBindTexture(GL_TEXTURE_2D, other.TextureId);
                            glUniform1i(glGetUniformLocation(render_pass.Program.Handle, render_pass.Input.c_str()), texture_unit);
                            glUniform2f(glGetUniformLocation(render_pass.Program.Handle, (render_pass.Input + "_resolution").c_str()), other.Width, other.Height);
                            ++texture_unit;
                        }
                    }
                }

                for (const GUIComponent& gui_component : live_glsl->GUIComponents) {
                    GLuint uniform_location = glGetUniformLocation(render_pass.Program.Handle, gui_component.UniformName.c_str());
                    switch (gui_component.UniformType) {
                        case EGUIUniformTypeFloat:
                            glUniform1f(uniform_location, gui_component.Data[0]);
                            break;
                        case EGUIUniformTypeVec2:
                            glUniform2f(uniform_location, gui_component.Data[0], gui_component.Data[1]);
                            break;
                        case EGUIUniformTypeVec3:
                            glUniform3f(uniform_location, gui_component.Data[0], gui_component.Data[1], gui_component.Data[2]);
                            break;
                        case EGUIUniformTypeVec4:
                            glUniform4f(uniform_location, gui_component.Data[0], gui_component.Data[1], gui_component.Data[2], gui_component.Data[3]);
                            break;
                    }
                }

                for (const Texture& texture : render_pass.Textures) {
                    glActiveTexture(GL_TEXTURE0 + texture_unit);
                    glBindTexture(GL_TEXTURE_2D, texture.Id);
                    glUniform1i(glGetUniformLocation(render_pass.Program.Handle, texture.Binding.c_str()), texture_unit);
                    glUniform2f(glGetUniformLocation(render_pass.Program.Handle, (texture.Binding + "_resolution").c_str()), texture.Width, texture.Height);
                    ++texture_unit;
                }

                glBindVertexArray(live_glsl->VaoId);

                for (auto& render_pass : live_glsl->RenderPasses) {
                    if (render_pass.IsMain) {
                        GLint position_attrib = glGetAttribLocation(render_pass.Program.Handle, "position");
                        glVertexAttribPointer(position_attrib, 2, GL_FLOAT, GL_FALSE, 2 * sizeof(float), 0);
                        glEnableVertexAttribArray(position_attrib);
                    }
                }

                glDrawArrays(GL_TRIANGLES, 0, 6);
            }

            live_glsl->IsContinuousRendering = false;
            for (const auto& render_pass : live_glsl->RenderPasses) {
                live_glsl->IsContinuousRendering |= glGetUniformLocation(render_pass.Program.Handle, "time") != -1;
            }

            if (!live_glsl->Args.Output.empty()) {
                uint32_t width = live_glsl->WindowWidth * live_glsl->PixelDensity;
                uint32_t height = live_glsl->WindowHeight * live_glsl->PixelDensity;
                unsigned char* pixels = new unsigned char[3 * width * height];
                glReadPixels(0, 0, width, height, GL_RGB, GL_UNSIGNED_BYTE, pixels);

                int res = stbi_write_png(live_glsl->Args.Output.c_str(), width, height, 3, pixels, 3 * width);
                delete[] pixels;
                if (res == 0) {
                    fprintf(stderr, "Failed to write image to file: %s\n", live_glsl->Args.Output.c_str());
                    return EXIT_FAILURE;
                }
                return EXIT_SUCCESS;
            }
        } else {
            glBindFramebuffer(GL_FRAMEBUFFER, 0);
            glClear(GL_COLOR_BUFFER_BIT);
        }
        
        GUIRender(live_glsl->GUI);

        glfwSwapBuffers(live_glsl->GLFWWindowHandle);

        if (live_glsl->IsContinuousRendering) {
            glfwPollEvents();
        } else {
            glfwWaitEvents();
        }
    }

    return EXIT_SUCCESS;
}